

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

int __thiscall hwnet::util::TimerMgr::remove(TimerMgr *this,char *__filename)

{
  Timer *pTVar1;
  ulong uVar2;
  Timer *e;
  long lVar3;
  size_t sVar4;
  pointer ppTVar5;
  int iVar6;
  
  std::mutex::lock(&this->mtx);
  pTVar1 = *(Timer **)__filename;
  if ((((pTVar1->mMgr == this) && (sVar4 = pTVar1->mIndex, sVar4 != 0)) &&
      (uVar2 = this->elements_size, sVar4 <= uVar2)) &&
     (ppTVar5 = (this->elements).
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_start, ppTVar5[sVar4 - 1] == pTVar1)) {
    e = ppTVar5[uVar2 - 1];
    if (e == pTVar1) {
      sVar4 = uVar2 - 1;
      this->elements_size = sVar4;
    }
    else {
      swap(this,sVar4,e->mIndex);
      this->elements_size = this->elements_size - 1;
      change(this,e);
      sVar4 = this->elements_size;
      ppTVar5 = (this->elements).
                super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    ppTVar5[sVar4] = (Timer *)0x0;
    lVar3 = *(long *)__filename;
    *(undefined8 *)(lVar3 + 0x50) = 0;
    std::function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::util::Timer>_&)> *)(lVar3 + 0x10),
               (nullptr_t)0x0);
    std::__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)__filename + 0x68),
               (__shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)__filename);
    iVar6 = (int)CONCAT71((int7)((ulong)__filename >> 8),1);
  }
  else {
    iVar6 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar6;
}

Assistant:

bool remove(Timer::Ptr &e) {
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this == e->mMgr) {
			if(e->mIndex == 0 || e->mIndex > this->elements_size) {
				return false;
			}

			auto offsetIdx = getOffset(e->mIndex);
			if(this->elements[offsetIdx] != e.get()) {
				return false;
			}

			auto tail = this->elements[this->elements_size-1];
			
			if(tail == e.get()) {
				this->elements_size--;
			} else {
				this->swap(e->mIndex,tail->mIndex);
				this->elements_size--;
				this->change(tail);
			}

			this->elements[this->elements_size] = nullptr;
			e->mIndex = 0;
			e->mCallback = nullptr;
			e->selfPtr = e;
			return true;
		} else {
			return false;
		} 
	}